

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O3

void __thiscall
Manifold_PartialRevolveOffset_Test::TestBody(Manifold_PartialRevolveOffset_Test *this)

{
  int iVar1;
  pointer *__ptr;
  char *pcVar2;
  ulong uVar3;
  Manifold revolute;
  Polygons polys;
  Polygons rotatedPolys;
  undefined4 in_stack_ffffffffffffff5c;
  vector in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  AssertHelper local_90;
  char *in_stack_ffffffffffffff78;
  pointer in_stack_ffffffffffffff88;
  pointer in_stack_ffffffffffffff90;
  pointer in_stack_ffffffffffffff98;
  Polygons local_60;
  vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  local_48;
  
  SquareHole((Polygons *)&stack0xffffffffffffff88,10.0);
  manifold::Manifold::Manifold((Manifold *)&stack0xffffffffffffff78);
  if ((in_stack_ffffffffffffff88->
      super__Vector_base<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (in_stack_ffffffffffffff88->
      super__Vector_base<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar3 = 0;
    do {
      std::
      vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
      ::vector(&local_48,
               (vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
                *)&stack0xffffffffffffff88);
      RotatePolygons(&local_60,&local_48,(int)uVar3);
      std::
      vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
      ::~vector(&local_48);
      manifold::Manifold::Revolve((vector *)&stack0xffffffffffffff60,(int)&local_60,180.0);
      manifold::Manifold::operator=
                ((Manifold *)&stack0xffffffffffffff78,(Manifold *)&stack0xffffffffffffff60);
      manifold::Manifold::~Manifold((Manifold *)&stack0xffffffffffffff60);
      iVar1 = manifold::Manifold::Genus();
      local_90.data_._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&stack0xffffffffffffff60,"revolute.Genus()","1",
                 (int *)&stack0xffffffffffffff58,(int *)&local_90);
      if (in_stack_ffffffffffffff60 == (vector)0x0) {
        testing::Message::Message((Message *)&stack0xffffffffffffff58);
        pcVar2 = "";
        if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = (local_98->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
                   ,0x163,pcVar2);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&stack0xffffffffffffff58);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(in_stack_ffffffffffffff5c,iVar1) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff5c,iVar1) + 8))();
        }
      }
      if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_98,local_98);
      }
      manifold::Manifold::SurfaceArea();
      testing::internal::DoubleNearPredFormat
                ((char *)CONCAT71(in_stack_ffffffffffffff61,in_stack_ffffffffffffff60),
                 (char *)CONCAT44(in_stack_ffffffffffffff5c,iVar1),in_stack_ffffffffffffff78,
                 (double)in_stack_ffffffffffffff98,(double)in_stack_ffffffffffffff90,
                 (double)in_stack_ffffffffffffff88);
      if (in_stack_ffffffffffffff60 == (vector)0x0) {
        testing::Message::Message((Message *)&stack0xffffffffffffff58);
        pcVar2 = "";
        if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = (local_98->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
                   ,0x164,pcVar2);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&stack0xffffffffffffff58);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(in_stack_ffffffffffffff5c,iVar1) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff5c,iVar1) + 8))();
        }
      }
      if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_98,local_98);
      }
      manifold::Manifold::Volume();
      testing::internal::DoubleNearPredFormat
                ((char *)CONCAT71(in_stack_ffffffffffffff61,in_stack_ffffffffffffff60),
                 (char *)CONCAT44(in_stack_ffffffffffffff5c,iVar1),in_stack_ffffffffffffff78,
                 (double)in_stack_ffffffffffffff98,(double)in_stack_ffffffffffffff90,
                 (double)in_stack_ffffffffffffff88);
      if (in_stack_ffffffffffffff60 == (vector)0x0) {
        testing::Message::Message((Message *)&stack0xffffffffffffff58);
        pcVar2 = "";
        if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = (local_98->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
                   ,0x165,pcVar2);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&stack0xffffffffffffff58);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(in_stack_ffffffffffffff5c,iVar1) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff5c,iVar1) + 8))();
        }
      }
      if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_98,local_98);
      }
      std::
      vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
      ::~vector(&local_60);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)(in_stack_ffffffffffffff88->
                                   super__Vector_base<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(in_stack_ffffffffffffff88->
                                   super__Vector_base<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  manifold::Manifold::~Manifold((Manifold *)&stack0xffffffffffffff78);
  std::
  vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  ::~vector((vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
             *)&stack0xffffffffffffff88);
  return;
}

Assistant:

TEST(Manifold, PartialRevolveOffset) {
  Polygons polys = SquareHole(10.0);

  Manifold revolute;
  for (size_t i = 0; i < polys[0].size(); i++) {
    Polygons rotatedPolys = RotatePolygons(polys, i);
    revolute = Manifold::Revolve(rotatedPolys, 48, 180);
    EXPECT_EQ(revolute.Genus(), 1);
    EXPECT_NEAR(revolute.SurfaceArea(), 777.0, 1.0);
    EXPECT_NEAR(revolute.Volume(), 376.0, 1.0);
  }
}